

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

int NULLCTypeInfo::TypeArgumentCount(int *typeID)

{
  uint uVar1;
  ExternTypeInfo *pEVar2;
  char *pcVar3;
  
  if (linker != 0) {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*typeID);
    if (pEVar2->subCat == CAT_FUNCTION) {
      uVar1 = (pEVar2->field_8).arrSize;
    }
    else {
      pcVar3 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar2->offsetToName);
      nullcThrowError("typeid::argumentCount received type (%s) that is not a function",pcVar3);
      uVar1 = 0xffffffff;
    }
    return uVar1;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xec,"int NULLCTypeInfo::TypeArgumentCount(int *)");
}

Assistant:

int TypeArgumentCount(int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("typeid::argumentCount received type (%s) that is not a function", &linker->exSymbols[type.offsetToName]);
			return -1;
		}
		return type.memberCount;
	}